

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

_Bool SaveFileData(char *fileName,void *data,uint bytesToWrite)

{
  _Bool _Var1;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  char *text;
  
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
    return false;
  }
  if (saveFileData != (SaveFileDataCallback)0x0) {
    _Var1 = (*saveFileData)(fileName,data,bytesToWrite);
    return _Var1;
  }
  __s = fopen(fileName,"wb");
  if (__s == (FILE *)0x0) {
    TraceLog(4,"FILEIO: [%s] Failed to open file",fileName);
    return false;
  }
  sVar3 = fwrite(data,1,(ulong)bytesToWrite,__s);
  if ((uint)sVar3 == 0) {
    text = "FILEIO: [%s] Failed to write file";
  }
  else {
    if ((uint)sVar3 == bytesToWrite) {
      text = "FILEIO: [%s] File saved successfully";
      iVar2 = 3;
      goto LAB_00149e65;
    }
    text = "FILEIO: [%s] File partially written";
  }
  iVar2 = 4;
LAB_00149e65:
  TraceLog(iVar2,text,fileName);
  iVar2 = fclose(__s);
  return iVar2 == 0;
}

Assistant:

bool SaveFileData(const char *fileName, void *data, unsigned int bytesToWrite)
{
    bool success = false;

    if (fileName != NULL)
    {
        if (saveFileData)
        {
            return saveFileData(fileName, data, bytesToWrite);
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "wb");

        if (file != NULL)
        {
            unsigned int count = (unsigned int)fwrite(data, sizeof(unsigned char), bytesToWrite, file);

            if (count == 0) TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to write file", fileName);
            else if (count != bytesToWrite) TRACELOG(LOG_WARNING, "FILEIO: [%s] File partially written", fileName);
            else TRACELOG(LOG_INFO, "FILEIO: [%s] File saved successfully", fileName);

            int result = fclose(file);
            if (result == 0) success = true;
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return success;
}